

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

N_Vector N_VNew_SensWrapper(int count,N_Vector w)

{
  N_Vector p_Var1;
  int local_2c;
  int i;
  N_Vector v;
  N_Vector w_local;
  N_Vector p_Stack_10;
  int count_local;
  
  p_Stack_10 = N_VNewEmpty_SensWrapper(count);
  if (p_Stack_10 == (N_Vector)0x0) {
    p_Stack_10 = (N_Vector)0x0;
  }
  else {
    for (local_2c = 0; local_2c < *(int *)((long)p_Stack_10->content + 8); local_2c = local_2c + 1)
    {
      p_Var1 = N_VClone(w);
      *(N_Vector *)(*p_Stack_10->content + (long)local_2c * 8) = p_Var1;
      if (*(long *)(*p_Stack_10->content + (long)local_2c * 8) == 0) {
        N_VDestroy(p_Stack_10);
        return (N_Vector)0x0;
      }
    }
    *(undefined4 *)((long)p_Stack_10->content + 0xc) = 1;
  }
  return p_Stack_10;
}

Assistant:

N_Vector N_VNew_SensWrapper(int count, N_Vector w)
{
  N_Vector v;
  int i;

  v = NULL;
  v = N_VNewEmpty_SensWrapper(count);
  if (v == NULL) return(NULL);

  for (i=0; i < NV_NVECS_SW(v); i++) {
    NV_VEC_SW(v,i) = N_VClone(w);
    if (NV_VEC_SW(v,i) == NULL) { N_VDestroy(v); return(NULL); }
  }

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  return(v);
}